

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.cpp
# Opt level: O0

void __thiscall C_A_T_C_H_T_E_S_T_0::visitor::operator()(visitor *this)

{
  int local_e0 [5];
  Decomposer local_c9;
  int *local_c8;
  BinaryExpr<const_int_&,_const_int_&> local_c0;
  StringRef local_90;
  SourceLineInfo local_80;
  StringRef local_70;
  undefined1 local_60 [8];
  AssertionHandler catchAssertionHandler;
  visitor_conflict *this_local;
  
  catchAssertionHandler.m_resultCapture = (IResultCapture *)this;
  local_70 = operator____catch_sr("REQUIRE",7);
  Catch::SourceLineInfo::SourceLineInfo
            (&local_80,
             "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/test/visitor.cpp"
             ,0x18);
  Catch::StringRef::StringRef(&local_90,"value == -1");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)local_60,&local_70,&local_80,local_90,Normal);
  local_c8 = (int *)Catch::Decomposer::operator<=(&local_c9,&this->i);
  local_e0[0] = -1;
  Catch::ExprLhs<int_const&>::operator==(&local_c0,(ExprLhs<int_const&> *)&local_c8,local_e0);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)local_60,&local_c0.super_ITransientExpression);
  Catch::BinaryExpr<const_int_&,_const_int_&>::~BinaryExpr(&local_c0);
  Catch::AssertionHandler::complete((AssertionHandler *)local_60);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)local_60);
  return;
}

Assistant:

void operator()(nullopt_t) const
        {
            REQUIRE(value == -1);
        }